

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

rbu_file * rbuFindMaindb(rbu_vfs *pRbuVfs,char *zWal,int bRbu)

{
  bool bVar1;
  rbu_file *local_28;
  rbu_file *pDb;
  int bRbu_local;
  char *zWal_local;
  rbu_vfs *pRbuVfs_local;
  
  sqlite3_mutex_enter(pRbuVfs->mutex);
  if (bRbu == 0) {
    local_28 = pRbuVfs->pMain;
    while( true ) {
      bVar1 = false;
      if (local_28 != (rbu_file *)0x0) {
        bVar1 = local_28->zWal != zWal;
      }
      if (!bVar1) break;
      local_28 = local_28->pMainNext;
    }
  }
  else {
    local_28 = pRbuVfs->pMainRbu;
    while( true ) {
      bVar1 = false;
      if (local_28 != (rbu_file *)0x0) {
        bVar1 = local_28->zWal != zWal;
      }
      if (!bVar1) break;
      local_28 = local_28->pMainRbuNext;
    }
  }
  sqlite3_mutex_leave(pRbuVfs->mutex);
  return local_28;
}

Assistant:

static rbu_file *rbuFindMaindb(rbu_vfs *pRbuVfs, const char *zWal, int bRbu){
  rbu_file *pDb;
  sqlite3_mutex_enter(pRbuVfs->mutex);
  if( bRbu ){
    for(pDb=pRbuVfs->pMainRbu; pDb && pDb->zWal!=zWal; pDb=pDb->pMainRbuNext){}
  }else{
    for(pDb=pRbuVfs->pMain; pDb && pDb->zWal!=zWal; pDb=pDb->pMainNext){}
  }
  sqlite3_mutex_leave(pRbuVfs->mutex);
  return pDb;
}